

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void __thiscall
gimage::Polygon::getVEdges
          (Polygon *this,vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *list)

{
  bool bVar1;
  size_type sVar2;
  VEdge *pVVar3;
  const_reference pvVar4;
  long x0;
  value_type *__x;
  long y1;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  in_RDI;
  VEdge v;
  size_t i;
  size_t j;
  vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *in_stack_ffffffffffffff78;
  vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *in_stack_ffffffffffffff90;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __last;
  VEdge local_48;
  VEdge *local_20;
  VEdge *local_18;
  
  std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>::clear
            ((vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *)0x1887eb);
  sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                    ((vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_> *)
                     in_RDI._M_current);
  local_18 = (VEdge *)(sVar2 - 1);
  local_20 = (VEdge *)0x0;
  while (__last._M_current = local_20,
        pVVar3 = (VEdge *)std::
                          vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                          ::size(in_RDI._M_current), __last._M_current < pVVar3) {
    pvVar4 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[]((vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                         *)in_RDI._M_current,(size_type)local_20);
    x0 = gmath::SVector<long,_2>::operator[](pvVar4,0);
    pvVar4 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[]((vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                         *)in_RDI._M_current,(size_type)local_20);
    __x = (value_type *)gmath::SVector<long,_2>::operator[](pvVar4,1);
    pvVar4 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[]((vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                         *)in_RDI._M_current,(size_type)local_18);
    in_stack_ffffffffffffff90 =
         (vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *)
         gmath::SVector<long,_2>::operator[](pvVar4,0);
    pvVar4 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[]((vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                         *)in_RDI._M_current,(size_type)local_18);
    y1 = gmath::SVector<long,_2>::operator[](pvVar4,1);
    VEdge::VEdge(&local_48,x0,(long)__x,(long)in_stack_ffffffffffffff90,y1);
    bVar1 = VEdge::isValid(&local_48);
    if (bVar1) {
      std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>::push_back
                (in_stack_ffffffffffffff90,__x);
    }
    local_18 = local_20;
    local_20 = (VEdge *)((long)&local_20->ymin + 1);
  }
  std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>::begin(in_stack_ffffffffffffff78);
  std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>::end(in_stack_ffffffffffffff78);
  std::
  sort<__gnu_cxx::__normal_iterator<gimage::VEdge*,std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>>,bool(*)(gimage::VEdge_const&,gimage::VEdge_const&)>
            (in_RDI,__last,(_func_bool_VEdge_ptr_VEdge_ptr *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void Polygon::getVEdges(std::vector<VEdge> &list) const
{
  list.clear();

  size_t j=vertex.size()-1;
  for (size_t i=0; i<vertex.size(); i++)
  {
    VEdge v(vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1]);

    if (v.isValid())
    {
      list.push_back(v);
    }

    j=i;
  }

  std::sort(list.begin(), list.end(), compareY);
}